

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

previous_contract *
cppwinrt::decode_previous_contract_attribute
          (previous_contract *__return_storage_ptr__,CustomAttribute *attribute)

{
  uint uVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  CustomAttributeSig signature;
  
  winmd::reader::CustomAttribute::Value(&signature,attribute);
  if (2 < (ulong)(((long)signature.m_fixed_args.
                         super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)signature.m_fixed_args.
                        super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38)) {
    (__return_storage_ptr__->contract_to)._M_len = 0;
    (__return_storage_ptr__->contract_to)._M_str = (char *)0x0;
    (__return_storage_ptr__->contract_from)._M_len = 0;
    (__return_storage_ptr__->contract_from)._M_str = (char *)0x0;
    __return_storage_ptr__->version_low = 0;
    __return_storage_ptr__->version_high = 0;
    bVar2 = get_attribute_value<std::basic_string_view<char,std::char_traits<char>>>
                      (signature.m_fixed_args.
                       super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    (__return_storage_ptr__->contract_from)._M_len = bVar2._M_len;
    (__return_storage_ptr__->contract_from)._M_str = bVar2._M_str;
    uVar1 = get_integer_attribute<unsigned_int>
                      (signature.m_fixed_args.
                       super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    __return_storage_ptr__->version_low = uVar1;
    uVar1 = get_integer_attribute<unsigned_int>
                      (signature.m_fixed_args.
                       super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2);
    __return_storage_ptr__->version_high = uVar1;
    if ((long)signature.m_fixed_args.
              super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)signature.m_fixed_args.
              super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
              ._M_impl.super__Vector_impl_data._M_start == 0xe0) {
      bVar2 = get_attribute_value<std::basic_string_view<char,std::char_traits<char>>>
                        (signature.m_fixed_args.
                         super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                         ._M_impl.super__Vector_impl_data._M_start + 3);
      (__return_storage_ptr__->contract_to)._M_len = bVar2._M_len;
      (__return_storage_ptr__->contract_to)._M_str = bVar2._M_str;
    }
    winmd::reader::CustomAttributeSig::~CustomAttributeSig(&signature);
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/helpers.h"
                ,0x183,
                "previous_contract cppwinrt::decode_previous_contract_attribute(const CustomAttribute &)"
               );
}

Assistant:

static previous_contract decode_previous_contract_attribute(CustomAttribute const& attribute)
    {
        // PreviousContractVersionAttribute has two constructors:
        //      .ctor(string fromContract, uint32 versionLow, uint32 versionHigh)
        //      .ctor(string fromContract, uint32 versionLow, uint32 versionHigh, string contractTo)
        auto signature = attribute.Value();
        auto& args = signature.FixedArgs();
        assert(args.size() >= 3);

        previous_contract result{};
        result.contract_from = get_attribute_value<std::string_view>(args[0]);
        result.version_low = get_integer_attribute<uint32_t>(args[1]);
        result.version_high = get_integer_attribute<uint32_t>(args[2]);
        if (args.size() == 4)
        {
            result.contract_to = get_attribute_value<std::string_view>(args[3]);
        }

        return result;
    }